

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::IntConstOpnd::IsEqualInternal(IntConstOpnd *this,Opnd *opnd)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  
  if ((this->super_Opnd).m_kind != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x5d5,"(m_kind == OpndKindIntConst)","m_kind == OpndKindIntConst");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((opnd->m_kind == OpndKindIntConst) && ((this->super_Opnd).m_type == opnd->m_type)) {
    lVar1 = (this->super_EncodableOpnd<long>).m_value;
    pIVar5 = Opnd::AsIntConstOpnd(opnd);
    bVar3 = lVar1 == (pIVar5->super_EncodableOpnd<long>).m_value;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
IntConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindIntConst);
    if (!opnd->IsIntConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsIntConstOpnd()->m_value;
}